

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ImFont(ImFont *this)

{
  ImVec2 local_24 [2];
  ImFont *local_10;
  ImFont *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->DisplayOffset);
  ImVector<ImFontGlyph>::ImVector(&this->Glyphs);
  ImVector<float>::ImVector(&this->IndexAdvanceX);
  ImVector<unsigned_short>::ImVector(&this->IndexLookup);
  this->Scale = 1.0;
  this->FallbackChar = 0x3f;
  ImVec2::ImVec2(local_24,0.0,0.0);
  this->DisplayOffset = local_24[0];
  ClearOutputData(this);
  return;
}

Assistant:

ImFont::ImFont()
{
    Scale = 1.0f;
    FallbackChar = (ImWchar)'?';
    DisplayOffset = ImVec2(0.0f, 0.0f);
    ClearOutputData();
}